

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.h
# Opt level: O0

Context __thiscall
mp::
FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>,TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRange>>,mp::FlatModel<mp::DefaultFlatModelParams>>
::Convert<mp::ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,mp::AlgConRhs<2>>>>
          (FlatConverter<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>
           *this,ConditionalConstraint<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>
                 *param_2)

{
  BasicCStringRef<char> *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  allocator<char> *in_stack_ffffffffffffff50;
  undefined8 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  Error *in_stack_ffffffffffffff68;
  CStringRef in_stack_ffffffffffffff70;
  
  this_00 = (BasicCStringRef<char> *)__cxa_allocate_exception(0x18);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          &stack0xffffffffffffff47;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (char *)in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
  s = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CustomConstraintData<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>,_std::array<int,_0UL>,_mp::CondConId<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRhs<2>_>_>_>
      ::GetTypeName();
  std::operator+(__lhs,(char *)this_00);
  std::operator+(__lhs,(char *)this_00);
  TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>::
  GetTypeName();
  std::operator+(__lhs,(char *)this_00);
  std::operator+(__lhs,(char *)this_00);
  fmt::BasicCStringRef<char>::BasicCStringRef(this_00,s);
  Error::Error(in_stack_ffffffffffffff68,in_stack_ffffffffffffff70,in_stack_ffffffffffffff64);
  __cxa_throw(this_00,&Error::typeinfo,Error::~Error);
}

Assistant:

Context Convert(const Constraint& ) {
    MP_RAISE(
          std::string("Constraint type '") +
            Constraint::GetTypeName() +
            "' is neither accepted by '" +
            ModelAPI::GetTypeName() +
            "', nor is conversion implemented");
    return Context::CTX_NONE;
  }